

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O2

void __thiscall btLCP::unpermute(btLCP *this)

{
  uint uVar1;
  btScalar *pbVar2;
  btScalar *pbVar3;
  int *piVar4;
  ulong uVar5;
  ulong uVar6;
  
  memcpy(this->m_tmp,this->m_x,(long)this->m_n << 2);
  pbVar2 = this->m_x;
  pbVar3 = this->m_tmp;
  piVar4 = this->m_p;
  uVar1 = this->m_n;
  uVar5 = 0;
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    pbVar2[piVar4[uVar5]] = pbVar3[uVar5];
  }
  memcpy(pbVar3,this->m_w,(long)(int)uVar1 << 2);
  pbVar2 = this->m_w;
  pbVar3 = this->m_tmp;
  piVar4 = this->m_p;
  uVar6 = 0;
  uVar5 = (ulong)(uint)this->m_n;
  if (this->m_n < 1) {
    uVar5 = uVar6;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    pbVar2[piVar4[uVar6]] = pbVar3[uVar6];
  }
  return;
}

Assistant:

void btLCP::unpermute()
{
  // now we have to un-permute x and w
  {
    memcpy (m_tmp,m_x,m_n*sizeof(btScalar));
    btScalar *x = m_x, *tmp = m_tmp;
    const int *p = m_p;
    const int n = m_n;
    for (int j=0; j<n; ++j) x[p[j]] = tmp[j];
  }
  {
    memcpy (m_tmp,m_w,m_n*sizeof(btScalar));
    btScalar *w = m_w, *tmp = m_tmp;
    const int *p = m_p;
    const int n = m_n;
    for (int j=0; j<n; ++j) w[p[j]] = tmp[j];
  }
}